

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::SumState<double>,double,duckdb::DoubleSumOperation<duckdb::RegularAdd>>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  double *pdVar1;
  undefined1 *puVar2;
  SumState<double> **states_00;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat idata;
  SelectionVector *local_b8;
  SumState<double> **local_b0;
  SelectionVector *local_70;
  double *local_68;
  ValidityMask local_60;
  
  if (*input == (Vector)0x0) {
    if (*states == (Vector)0x0) {
      pdVar1 = *(double **)(input + 0x20);
      states_00 = *(SumState<double> ***)(states + 0x20);
      FlatVector::VerifyFlatVector(input);
      UnaryFlatLoop<duckdb::SumState<double>,double,duckdb::DoubleSumOperation<duckdb::RegularAdd>>
                (pdVar1,aggr_input_data,states_00,(ValidityMask *)(input + 0x28),count);
      return;
    }
  }
  else if ((*input == (Vector)0x2) && (*states == (Vector)0x2)) {
    if ((*(byte **)(input + 0x28) != (byte *)0x0) && ((**(byte **)(input + 0x28) & 1) == 0)) {
      return;
    }
    pdVar1 = *(double **)(input + 0x20);
    puVar2 = (undefined1 *)**(undefined8 **)(states + 0x20);
    *puVar2 = 1;
    *(double *)(puVar2 + 8) = (double)(long)count * *pdVar1 + *(double *)(puVar2 + 8);
    return;
  }
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_70);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_b8);
  duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)states,(UnifiedVectorFormat *)count);
  UnaryScatterLoop<duckdb::SumState<double>,double,duckdb::DoubleSumOperation<duckdb::RegularAdd>>
            (local_68,aggr_input_data,local_b0,local_70,local_b8,&local_60,count);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_b8);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_70);
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}